

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O0

void operations_test<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>,viennamath::ct_constant<5l>>
               (ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
                *t,ct_constant<5L> *u,double t2,double u2)

{
  ostream *poVar1;
  ct_constant<5L> *rhs;
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
  *rhs_00;
  ct_constant<5L> *rhs_01;
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
  *rhs_02;
  ct_constant<5L> *rhs_03;
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
  *rhs_04;
  ct_constant<5L> *rhs_05;
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
  *rhs_06;
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>_>
  local_55 [2];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_div<double>,_viennamath::ct_constant<5L>_>
  local_4f [2];
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>_>
  local_49 [2];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>
  local_43 [2];
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>_>
  local_3d [2];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_constant<5L>_>
  local_37 [2];
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>_>
  local_31 [2];
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>
  local_2b;
  double local_28;
  double u2_local;
  double t2_local;
  ct_constant<5L> *u_local;
  ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
  *t_local;
  
  local_28 = u2;
  u2_local = t2;
  t2_local = (double)u;
  u_local = (ct_constant<5L> *)t;
  poVar1 = std::operator<<((ostream *)&std::cout,"LHS: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
                              *)u_local);
  poVar1 = std::operator<<(poVar1,", RHS: ");
  poVar1 = viennamath::operator<<(poVar1,(ct_constant<5L> *)t2_local);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::operator+
            ((type *)u_local,
             (ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
              *)t2_local,rhs);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>>
            (&local_2b,u2_local + local_28);
  viennamath::operator+((type *)t2_local,u_local,rhs_00);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>>
            (local_31,local_28 + u2_local);
  viennamath::operator-
            ((type *)u_local,
             (ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
              *)t2_local,rhs_01);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>,viennamath::op_minus<double>,viennamath::ct_constant<5l>>>
            (local_37,u2_local - local_28);
  viennamath::operator-((type *)t2_local,u_local,rhs_02);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>>
            (local_3d,local_28 - u2_local);
  viennamath::operator*
            ((type *)u_local,
             (ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
              *)t2_local,rhs_03);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>
            (local_43,u2_local * local_28);
  viennamath::operator*((type *)t2_local,u_local,rhs_04);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>>
            (local_49,local_28 * u2_local);
  viennamath::operator/
            ((type *)u_local,
             (ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
              *)t2_local,rhs_05);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>,viennamath::op_div<double>,viennamath::ct_constant<5l>>>
            (local_4f,u2_local / local_28);
  viennamath::operator/((type *)t2_local,u_local,rhs_06);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>>
            (local_55,local_28 / u2_local);
  return;
}

Assistant:

void operations_test(T const & t, U const & u, double t2, double u2)
{
  std::cout << "LHS: " << t << ", RHS: " << u << std::endl;
  evaluations_test(t + u, t2 + u2);
  evaluations_test(u + t, u2 + t2);
  evaluations_test(t - u, t2 - u2);
  evaluations_test(u - t, u2 - t2);
  evaluations_test(t * u, t2 * u2);
  evaluations_test(u * t, u2 * t2);
  evaluations_test(t / u, t2 / u2);
  evaluations_test(u / t, u2 / t2);
}